

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O0

void __thiscall
MIDIStreamer::CreateSMF(MIDIStreamer *this,TArray<unsigned_char,_unsigned_char> *file,int looplimit)

{
  BYTE *pBVar1;
  TArray<unsigned_char,_unsigned_char> *pTVar2;
  int iVar3;
  uint uVar4;
  uchar *puVar5;
  undefined4 extraout_var;
  int local_6c;
  uchar local_58 [3];
  byte local_55;
  DWORD len;
  BYTE status;
  DWORD *pDStack_50;
  BYTE *bytes;
  DWORD len_1;
  uint local_3c;
  DWORD (*paDStack_38) [384];
  DWORD tempo;
  DWORD *event;
  DWORD *event_end;
  DWORD local_20;
  int iStack_1c;
  BYTE running_status;
  DWORD delay;
  int looplimit_local;
  TArray<unsigned_char,_unsigned_char> *file_local;
  MIDIStreamer *this_local;
  
  local_20 = 0;
  event_end._7_1_ = 0xff;
  iStack_1c = looplimit;
  _delay = file;
  file_local = (TArray<unsigned_char,_unsigned_char> *)this;
  (*(this->super_MusInfo)._vptr_MusInfo[0x16])(this,1);
  if (iStack_1c < 1) {
    local_6c = 0x1e;
  }
  else {
    local_6c = iStack_1c;
  }
  this->LoopLimit = local_6c;
  (*(this->super_MusInfo)._vptr_MusInfo[0x18])();
  this->Tempo = this->InitialTempo;
  TArray<unsigned_char,_unsigned_char>::Reserve(_delay,0x1d);
  puVar5 = TArray<unsigned_char,_unsigned_char>::operator[](_delay,0);
  builtin_memcpy(puVar5,"MThd",5);
  puVar5[5] = '\0';
  puVar5[6] = '\0';
  puVar5[7] = '\x06';
  pBVar1 = puVar5 + 8;
  pBVar1[0] = '\0';
  pBVar1[1] = '\0';
  pBVar1[2] = '\0';
  pBVar1[3] = '\x01';
  pBVar1[4] = '\0';
  pBVar1[5] = '\0';
  pBVar1[6] = 'M';
  pBVar1[7] = 'T';
  pBVar1 = puVar5 + 0x10;
  pBVar1[0] = 'r';
  pBVar1[1] = 'k';
  pBVar1[2] = '\0';
  pBVar1[3] = '\0';
  pBVar1[4] = '\0';
  pBVar1[5] = '\0';
  pBVar1[6] = '\0';
  pBVar1[7] = 0xff;
  puVar5[0x18] = 'Q';
  puVar5[0x19] = '\x03';
  puVar5[0x1a] = '\0';
  puVar5[0x1b] = '\0';
  puVar5[0x1c] = '\0';
  iVar3 = this->Division;
  puVar5 = TArray<unsigned_char,_unsigned_char>::operator[](_delay,0xc);
  *puVar5 = (uchar)((uint)iVar3 >> 8);
  iVar3 = this->Division;
  puVar5 = TArray<unsigned_char,_unsigned_char>::operator[](_delay,0xd);
  *puVar5 = (uchar)iVar3;
  iVar3 = this->InitialTempo;
  puVar5 = TArray<unsigned_char,_unsigned_char>::operator[](_delay,0x1a);
  *puVar5 = (uchar)((uint)iVar3 >> 0x10);
  iVar3 = this->InitialTempo;
  puVar5 = TArray<unsigned_char,_unsigned_char>::operator[](_delay,0x1b);
  *puVar5 = (uchar)((uint)iVar3 >> 8);
  iVar3 = this->InitialTempo;
  puVar5 = TArray<unsigned_char,_unsigned_char>::operator[](_delay,0x1c);
  *puVar5 = (uchar)iVar3;
  while (iVar3 = (*(this->super_MusInfo)._vptr_MusInfo[0x19])(), (((byte)iVar3 ^ 0xff) & 1) != 0) {
    iVar3 = (*(this->super_MusInfo)._vptr_MusInfo[0x1c])
                      (this,this->Events,this->Events + 1,600000000);
    event = (DWORD *)CONCAT44(extraout_var,iVar3);
    paDStack_38 = this->Events;
    while (paDStack_38 < event) {
      local_20 = (*paDStack_38)[0] + local_20;
      if ((*paDStack_38)[2] >> 0x18 == 1) {
        WriteVarLen(_delay,local_20);
        local_20 = 0;
        local_3c = (*paDStack_38)[2] & 0xffffff;
        len_1._3_1_ = 0xff;
        TArray<unsigned_char,_unsigned_char>::Push(_delay,(uchar *)((long)&len_1 + 3));
        len_1._2_1_ = 0x51;
        TArray<unsigned_char,_unsigned_char>::Push(_delay,(uchar *)((long)&len_1 + 2));
        len_1._1_1_ = 3;
        TArray<unsigned_char,_unsigned_char>::Push(_delay,(uchar *)((long)&len_1 + 1));
        len_1._0_1_ = (undefined1)(local_3c >> 0x10);
        TArray<unsigned_char,_unsigned_char>::Push(_delay,(uchar *)&len_1);
        bytes._7_1_ = (undefined1)(local_3c >> 8);
        TArray<unsigned_char,_unsigned_char>::Push(_delay,(uchar *)((long)&bytes + 7));
        bytes._6_1_ = (undefined1)local_3c;
        TArray<unsigned_char,_unsigned_char>::Push(_delay,(uchar *)((long)&bytes + 6));
        event_end._7_1_ = 0xff;
      }
      else if ((*paDStack_38)[2] >> 0x18 == 0x80) {
        WriteVarLen(_delay,local_20);
        local_20 = 0;
        bytes._0_4_ = (*paDStack_38)[2] & 0xffffff;
        pDStack_50 = *paDStack_38 + 3;
        if ((char)*pDStack_50 == -0x10) {
          bytes._0_4_ = (DWORD)bytes - 1;
          len._3_1_ = 0xf0;
          TArray<unsigned_char,_unsigned_char>::Push(_delay,(uchar *)((long)&len + 3));
          WriteVarLen(_delay,(DWORD)bytes);
          pTVar2 = _delay;
          uVar4 = TArray<unsigned_char,_unsigned_char>::Reserve(_delay,(DWORD)bytes);
          puVar5 = TArray<unsigned_char,_unsigned_char>::operator[](pTVar2,(ulong)uVar4);
          memcpy(puVar5,(char *)((long)pDStack_50 + 1),(ulong)(DWORD)bytes);
        }
        else {
          len._2_1_ = 0xf7;
          TArray<unsigned_char,_unsigned_char>::Push(_delay,(uchar *)((long)&len + 2));
          WriteVarLen(_delay,(DWORD)bytes);
          pTVar2 = _delay;
          uVar4 = TArray<unsigned_char,_unsigned_char>::Reserve(_delay,(DWORD)bytes);
          puVar5 = TArray<unsigned_char,_unsigned_char>::operator[](pTVar2,(ulong)uVar4);
          memcpy(puVar5,pDStack_50,(ulong)(DWORD)bytes);
        }
        event_end._7_1_ = 0xff;
      }
      else if ((*paDStack_38)[2] >> 0x18 == 0) {
        WriteVarLen(_delay,local_20);
        local_20 = 0;
        len._1_1_ = (byte)(*paDStack_38)[2];
        if (((*paDStack_38)[2] & 0xff) != (uint)event_end._7_1_) {
          event_end._7_1_ = len._1_1_;
          TArray<unsigned_char,_unsigned_char>::Push(_delay,(uchar *)((long)&len + 1));
        }
        len._0_1_ = (byte)((*paDStack_38)[2] >> 8) & 0x7f;
        TArray<unsigned_char,_unsigned_char>::Push(_delay,(uchar *)&len);
        if (MIDI_EventLengths[(int)((int)(uint)len._1_1_ >> 4 & 7)] == '\x02') {
          local_55 = (byte)((*paDStack_38)[2] >> 0x10) & 0x7f;
          TArray<unsigned_char,_unsigned_char>::Push(_delay,&local_55);
        }
      }
      if ((*paDStack_38)[2] < 0x80000000) {
        paDStack_38 = (DWORD (*) [384])(*paDStack_38 + 3);
      }
      else {
        paDStack_38 = (DWORD (*) [384])
                      (*paDStack_38 + ((((*paDStack_38)[2] & 0xffffff) + 3 >> 2) + 3));
      }
    }
  }
  WriteVarLen(_delay,local_20);
  local_58[2] = 0xff;
  TArray<unsigned_char,_unsigned_char>::Push(_delay,local_58 + 2);
  local_58[1] = 0x2f;
  TArray<unsigned_char,_unsigned_char>::Push(_delay,local_58 + 1);
  local_58[0] = '\0';
  TArray<unsigned_char,_unsigned_char>::Push(_delay,local_58);
  uVar4 = TArray<unsigned_char,_unsigned_char>::Size(_delay);
  iVar3 = uVar4 - 0x16;
  puVar5 = TArray<unsigned_char,_unsigned_char>::operator[](_delay,0x12);
  *puVar5 = (uchar)((uint)iVar3 >> 0x18);
  puVar5 = TArray<unsigned_char,_unsigned_char>::operator[](_delay,0x13);
  *puVar5 = (uchar)((uint)iVar3 >> 0x10);
  puVar5 = TArray<unsigned_char,_unsigned_char>::operator[](_delay,0x14);
  *puVar5 = (uchar)((uint)iVar3 >> 8);
  puVar5 = TArray<unsigned_char,_unsigned_char>::operator[](_delay,0x15);
  *puVar5 = (uchar)iVar3;
  this->LoopLimit = 0;
  return;
}

Assistant:

void MIDIStreamer::CreateSMF(TArray<BYTE> &file, int looplimit)
{
	DWORD delay = 0;
	BYTE running_status = 255;

	// Always create songs aimed at GM devices.
	CheckCaps(MOD_MIDIPORT);
	LoopLimit = looplimit <= 0 ? EXPORT_LOOP_LIMIT : looplimit;
	DoRestart();
	Tempo = InitialTempo;

	file.Reserve(sizeof(StaticMIDIhead));
	memcpy(&file[0], StaticMIDIhead, sizeof(StaticMIDIhead));
	file[12] = Division >> 8;
	file[13] = Division & 0xFF;
	file[26] = InitialTempo >> 16;
	file[27] = InitialTempo >> 8;
	file[28] = InitialTempo;

	while (!CheckDone())
	{
		DWORD *event_end = MakeEvents(Events[0], &Events[0][MAX_EVENTS*3], 1000000*600);
		for (DWORD *event = Events[0]; event < event_end; )
		{
			delay += event[0];
			if (MEVT_EVENTTYPE(event[2]) == MEVT_TEMPO)
			{
				WriteVarLen(file, delay);
				delay = 0;
				DWORD tempo = MEVT_EVENTPARM(event[2]);
				file.Push(MIDI_META);
				file.Push(MIDI_META_TEMPO);
				file.Push(3);
				file.Push(BYTE(tempo >> 16));
				file.Push(BYTE(tempo >> 8));
				file.Push(BYTE(tempo));
				running_status = 255;
			}
			else if (MEVT_EVENTTYPE(event[2]) == MEVT_LONGMSG)
			{
				WriteVarLen(file, delay);
				delay = 0;
				DWORD len = MEVT_EVENTPARM(event[2]);
				BYTE *bytes = (BYTE *)&event[3];
				if (bytes[0] == MIDI_SYSEX)
				{
					len--;
					file.Push(MIDI_SYSEX);
					WriteVarLen(file, len);
					memcpy(&file[file.Reserve(len)], bytes + 1, len);
				}
				else
				{
					file.Push(MIDI_SYSEXEND);
					WriteVarLen(file, len);
					memcpy(&file[file.Reserve(len)], bytes, len);
				}
				running_status = 255;
			}
			else if (MEVT_EVENTTYPE(event[2]) == 0)
			{
				WriteVarLen(file, delay);
				delay = 0;
				BYTE status = BYTE(event[2]);
				if (status != running_status)
				{
					running_status = status;
					file.Push(status);
				}
				file.Push(BYTE((event[2] >> 8) & 0x7F));
				if (MIDI_EventLengths[(status >> 4) & 7] == 2)
				{
					file.Push(BYTE((event[2] >> 16) & 0x7F));
				}
			}
			// Advance to next event
			if (event[2] < 0x80000000)
			{ // short message
				event += 3;
			}
			else
			{ // long message
				event += 3 + ((MEVT_EVENTPARM(event[2]) + 3) >> 2);
			}
		}
	}

	// End track
	WriteVarLen(file, delay);
	file.Push(MIDI_META);
	file.Push(MIDI_META_EOT);
	file.Push(0);

	// Fill in track length
	DWORD len = file.Size() - 22;
	file[18] = BYTE(len >> 24);
	file[19] = BYTE(len >> 16);
	file[20] = BYTE(len >> 8);
	file[21] = BYTE(len & 255);

	LoopLimit = 0;
}